

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  int *piVar1;
  char *pcVar2;
  ImGuiSettingsHandler *pIVar3;
  ImGuiContext_conflict1 *pIVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  ImGuiContext_conflict1 *ctx;
  long lVar8;
  long lVar9;
  
  pIVar4 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  iVar7 = (pIVar4->SettingsIniData).Buf.Capacity;
  if (iVar7 < 0) {
    iVar7 = iVar7 / 2 + iVar7;
    iVar5 = 0;
    if (0 < iVar7) {
      iVar5 = iVar7;
    }
    if (pIVar4 != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(pIVar4->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pcVar6 = (char *)(*GImAllocatorAllocFunc)((size_t)iVar5,GImAllocatorUserData);
    pcVar2 = (pIVar4->SettingsIniData).Buf.Data;
    if (pcVar2 != (char *)0x0) {
      memcpy(pcVar6,pcVar2,(long)(pIVar4->SettingsIniData).Buf.Size);
      pcVar2 = (pIVar4->SettingsIniData).Buf.Data;
      if ((pcVar2 != (char *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    }
    (pIVar4->SettingsIniData).Buf.Data = pcVar6;
    (pIVar4->SettingsIniData).Buf.Capacity = iVar5;
  }
  (pIVar4->SettingsIniData).Buf.Size = 0;
  if ((pIVar4->SettingsIniData).Buf.Capacity == 0) {
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pcVar6 = (char *)(*GImAllocatorAllocFunc)(8,GImAllocatorUserData);
    pcVar2 = (pIVar4->SettingsIniData).Buf.Data;
    if (pcVar2 != (char *)0x0) {
      memcpy(pcVar6,pcVar2,(long)(pIVar4->SettingsIniData).Buf.Size);
      pcVar2 = (pIVar4->SettingsIniData).Buf.Data;
      if ((pcVar2 != (char *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    }
    (pIVar4->SettingsIniData).Buf.Data = pcVar6;
    (pIVar4->SettingsIniData).Buf.Capacity = 8;
  }
  (pIVar4->SettingsIniData).Buf.Data[(pIVar4->SettingsIniData).Buf.Size] = '\0';
  (pIVar4->SettingsIniData).Buf.Size = (pIVar4->SettingsIniData).Buf.Size + 1;
  if (0 < (pIVar4->SettingsHandlers).Size) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      pIVar3 = (pIVar4->SettingsHandlers).Data;
      (**(code **)((long)&pIVar3->WriteAllFn + lVar8))
                (pIVar4,(long)&pIVar3->TypeName + lVar8,&pIVar4->SettingsIniData);
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x48;
    } while (lVar9 < (pIVar4->SettingsHandlers).Size);
  }
  if (out_size != (size_t *)0x0) {
    iVar7 = (pIVar4->SettingsIniData).Buf.Size;
    iVar5 = iVar7 + -1;
    if (iVar7 == 0) {
      iVar5 = 0;
    }
    *out_size = (long)iVar5;
  }
  pcVar2 = (pIVar4->SettingsIniData).Buf.Data;
  pcVar6 = ImGuiTextBuffer::EmptyString;
  if (pcVar2 != (char *)0x0) {
    pcVar6 = pcVar2;
  }
  return pcVar6;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}